

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O1

CK_RV __thiscall
SoftHSM::C_VerifyUpdate
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_BYTE_PTR pPart,CK_ULONG ulPartLen)

{
  bool bVar1;
  int iVar2;
  Session *this_00;
  MacAlgorithm *pMVar3;
  AsymmetricAlgorithm *pAVar4;
  CK_RV CVar5;
  ByteString local_50;
  
  if (this->isInitialised != true) {
    return 400;
  }
  if (pPart == (CK_BYTE_PTR)0x0) {
    return 7;
  }
  this_00 = (Session *)HandleManager::getSession(this->handleManager,hSession);
  if (this_00 == (Session *)0x0) {
    return 0xb3;
  }
  iVar2 = Session::getOpType(this_00);
  if (iVar2 != 6) {
    return 0x91;
  }
  pMVar3 = Session::getMacOp(this_00);
  if (pMVar3 == (MacAlgorithm *)0x0) {
    pAVar4 = Session::getAsymmetricCryptoOp(this_00);
    if ((pAVar4 != (AsymmetricAlgorithm *)0x0) &&
       (bVar1 = Session::getAllowMultiPartOp(this_00), bVar1)) {
      ByteString::ByteString(&local_50,pPart,ulPartLen);
      iVar2 = (*pAVar4->_vptr_AsymmetricAlgorithm[8])(pAVar4);
      if ((char)iVar2 == '\0') {
        CVar5 = 5;
        Session::resetOp(this_00);
      }
      else {
        CVar5 = 0;
        Session::setAllowSinglePartOp(this_00,false);
      }
      goto LAB_00137cab;
    }
  }
  else {
    pMVar3 = Session::getMacOp(this_00);
    if ((pMVar3 != (MacAlgorithm *)0x0) && (bVar1 = Session::getAllowMultiPartOp(this_00), bVar1)) {
      ByteString::ByteString(&local_50,pPart,ulPartLen);
      iVar2 = (*pMVar3->_vptr_MacAlgorithm[6])(pMVar3);
      if ((char)iVar2 == '\0') {
        CVar5 = 5;
        Session::resetOp(this_00);
      }
      else {
        CVar5 = 0;
        Session::setAllowSinglePartOp(this_00,false);
      }
LAB_00137cab:
      local_50._vptr_ByteString = (_func_int **)&PTR__ByteString_0019f880;
      std::_Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>::~_Vector_base
                (&local_50.byteString.
                  super__Vector_base<unsigned_char,_SecureAllocator<unsigned_char>_>);
      return CVar5;
    }
  }
  Session::resetOp(this_00);
  return 0x91;
}

Assistant:

CK_RV SoftHSM::C_VerifyUpdate(CK_SESSION_HANDLE hSession, CK_BYTE_PTR pPart, CK_ULONG ulPartLen)
{
	if (!isInitialised) return CKR_CRYPTOKI_NOT_INITIALIZED;

	if (pPart == NULL_PTR) return CKR_ARGUMENTS_BAD;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL) return CKR_SESSION_HANDLE_INVALID;

	// Check if we are doing the correct operation
	if (session->getOpType() != SESSION_OP_VERIFY)
		return CKR_OPERATION_NOT_INITIALIZED;

	if (session->getMacOp() != NULL)
		return MacVerifyUpdate(session, pPart, ulPartLen);
	else
		return AsymVerifyUpdate(session, pPart, ulPartLen);
}